

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall ninx::lexer::token::Text::get_identifier_abi_cxx11_(Text *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  long in_RSI;
  string identifier;
  locale local_a0 [8];
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  bool local_68;
  element_type *local_60;
  shared_count sStack_58;
  int local_50;
  bool local_4c;
  is_classifiedF local_40;
  
  if (get_identifier[abi:cxx11]()::identifierValidation == '\0') {
    iVar2 = __cxa_guard_acquire(&get_identifier[abi:cxx11]()::identifierValidation);
    if (iVar2 != 0) {
      boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
      basic_regex(&get_identifier::identifierValidation,"^\\s*[a-zA-Z][a-zA-Z0-9]*\\s*$",0);
      __cxa_atexit(boost::
                   basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
                   ~basic_regex,&get_identifier::identifierValidation,&__dso_handle);
      __cxa_guard_release(&get_identifier[abi:cxx11]()::identifierValidation);
    }
  }
  local_88._16_8_ = (char *)0x0;
  _Stack_70._M_current = (char *)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (char *)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (pointer)0x0;
  local_68 = false;
  local_60 = (element_type *)0x0;
  sStack_58.pi_ = (sp_counted_base *)0x0;
  local_50 = 0;
  local_4c = true;
  bVar1 = boost::
          regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )*(char **)(in_RSI + 0x10),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(*(char **)(in_RSI + 0x10) + *(long *)(in_RSI + 0x18)),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_98,&get_identifier::identifierValidation,match_any);
  boost::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_98);
  if (bVar1) {
    local_98._0_8_ = (pointer)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,*(long *)(in_RSI + 0x10),
               *(long *)(in_RSI + 0x18) + *(long *)(in_RSI + 0x10));
    std::locale::locale(local_a0);
    local_40.m_Type = 0x2000;
    std::locale::locale(&local_40.m_Locale,local_a0);
    boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_classifiedF>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               &local_40);
    std::locale::~locale(&local_40.m_Locale);
    std::locale::~locale(local_a0);
    psVar3 = (string *)operator_new(0x20);
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              (psVar3,local_98._0_8_,
               (pointer)(local_98._0_8_ +
                        (long)(pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_98._8_8_));
    (this->super_Token)._vptr_Token = (_func_int **)psVar3;
    if ((pointer)local_98._0_8_ != (pointer)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
  }
  else {
    (this->super_Token)._vptr_Token = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::string> ninx::lexer::token::Text::get_identifier() {
    // Check if the text is alphanumeric, and do not contain spaces
    static const boost::regex identifierValidation("^\\s*[a-zA-Z][a-zA-Z0-9]*\\s*$");
    if (!regex_match(this->get_text(), identifierValidation)) {
        return nullptr;
    }

    // Trim the text to extract the identifier
    std::string identifier {this->get_text()};
    boost::algorithm::trim(identifier);

    return std::make_unique<std::string>(identifier);
}